

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopFromTruthHex(char *pTruth)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  size_t sVar12;
  Vec_Int_t *p;
  int *__ptr;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar60;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar61;
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar28;
  
  sVar12 = strlen(pTruth);
  uVar19 = (uint)sVar12;
  uVar20 = 0x1f;
  if (uVar19 - 1 != 0) {
    for (; uVar19 - 1 >> uVar20 == 0; uVar20 = uVar20 - 1) {
    }
  }
  uVar15 = 2;
  if (1 < (int)uVar19) {
    uVar15 = (ulong)((uVar20 ^ 0xffffffe0) + 0x23);
  }
  if (1 << ((char)uVar15 - 2U & 0x1f) == uVar19) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    __ptr = (int *)malloc(400);
    p->pArray = __ptr;
    if ((int)uVar19 < 1) {
      uVar20 = 0;
    }
    else {
      iVar21 = uVar19 * 4;
      uVar16 = 0;
      do {
        iVar21 = iVar21 + -4;
        cVar1 = pTruth[uVar16];
        bVar11 = cVar1 - 0x30;
        if (9 < bVar11) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar11 = cVar1 + 0xa9;
          }
          else {
            if (5 < (byte)(cVar1 + 0xbfU)) {
              printf("String %s does not look like a hexadecimal representation of the truth table.\n"
                     ,pTruth);
              return (char *)0x0;
            }
            bVar11 = cVar1 - 0x37;
          }
        }
        uVar20 = 0;
        do {
          if ((bVar11 >> (uVar20 & 0x1f) & 1) != 0) {
            Vec_IntPush(p,iVar21 + uVar20);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != 4);
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar19 & 0x7fffffff));
      uVar20 = p->nSize;
      __ptr = p->pArray;
    }
    iVar21 = (int)uVar15;
    uVar19 = iVar21 + 3;
    pcVar13 = (char *)malloc((long)(int)(uVar20 * uVar19 + 1));
    pcVar13[(int)(uVar20 * uVar19)] = '\0';
    auVar10 = _DAT_0093d220;
    if (0 < (int)uVar20) {
      uVar22 = iVar21 + (uint)(iVar21 == 0);
      lVar18 = (ulong)uVar22 - 1;
      auVar23._8_4_ = (int)lVar18;
      auVar23._0_8_ = lVar18;
      auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
      pcVar17 = pcVar13 + 0xf;
      uVar16 = 0;
      do {
        uVar2 = __ptr[uVar16];
        lVar18 = uVar16 * uVar19;
        uVar14 = 0;
        auVar27 = _DAT_009b63a0;
        auVar29 = _DAT_009b63b0;
        auVar30 = _DAT_009b63c0;
        auVar31 = _DAT_009b63d0;
        auVar68 = _DAT_0093d210;
        auVar69 = _DAT_0093e4e0;
        auVar70 = _DAT_009b63f0;
        auVar71 = _DAT_009b63e0;
        do {
          auVar24 = auVar23 ^ auVar10;
          auVar39 = auVar68 ^ auVar10;
          iVar21 = auVar24._0_4_;
          iVar61 = -(uint)(iVar21 < auVar39._0_4_);
          iVar38 = auVar24._4_4_;
          auVar40._4_4_ = -(uint)(iVar38 < auVar39._4_4_);
          iVar60 = auVar24._8_4_;
          iVar65 = -(uint)(iVar60 < auVar39._8_4_);
          iVar26 = auVar24._12_4_;
          auVar40._12_4_ = -(uint)(iVar26 < auVar39._12_4_);
          auVar52._4_4_ = iVar61;
          auVar52._0_4_ = iVar61;
          auVar52._8_4_ = iVar65;
          auVar52._12_4_ = iVar65;
          auVar32 = pshuflw(in_XMM5,auVar52,0xe8);
          auVar42._4_4_ = -(uint)(auVar39._4_4_ == iVar38);
          auVar42._12_4_ = -(uint)(auVar39._12_4_ == iVar26);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar66 = pshuflw(in_XMM11,auVar42,0xe8);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar39 = pshuflw(auVar32,auVar40,0xe8);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar24 = (auVar39 | auVar66 & auVar32) ^ auVar24;
          auVar24 = packssdw(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 0xf] = (uVar2 >> ((uint)uVar14 & 0x1f) & 1) == 0 ^ 0x31;
          }
          auVar40 = auVar42 & auVar52 | auVar40;
          auVar24 = packssdw(auVar40,auVar40);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar39,auVar24 ^ auVar39);
          auVar24 = packsswb(auVar24,auVar24);
          bVar11 = (byte)uVar14;
          if ((auVar24._0_4_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 0xe] = (uVar2 >> (bVar11 & 0x1f) & 2) == 0 ^ 0x31;
          }
          auVar24 = auVar69 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar62._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar62._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar41._4_4_ = iVar61;
          auVar41._0_4_ = iVar61;
          auVar41._8_4_ = iVar65;
          auVar41._12_4_ = iVar65;
          iVar61 = -(uint)(auVar24._4_4_ == iVar38);
          iVar65 = -(uint)(auVar24._12_4_ == iVar26);
          auVar53._4_4_ = iVar61;
          auVar53._0_4_ = iVar61;
          auVar53._8_4_ = iVar65;
          auVar53._12_4_ = iVar65;
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar24 = auVar53 & auVar41 | auVar62;
          auVar24 = packssdw(auVar24,auVar24);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar3,auVar24 ^ auVar3);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
            pcVar17[uVar14 - 0xd] = (uVar2 >> (bVar11 & 0x1f) & 4) == 0 ^ 0x31;
          }
          auVar24 = pshufhw(auVar24,auVar41,0x84);
          auVar42 = pshufhw(auVar41,auVar53,0x84);
          auVar39 = pshufhw(auVar24,auVar62,0x84);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar39 | auVar42 & auVar24) ^ auVar33;
          auVar24 = packssdw(auVar33,auVar33);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._0_4_ >> 0x18 & 1) != 0) {
            pcVar17[uVar14 - 0xc] = (uVar2 >> (bVar11 & 0x1f) & 8) == 0 ^ 0x31;
          }
          auVar24 = auVar70 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar44._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar44._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar54._4_4_ = iVar61;
          auVar54._0_4_ = iVar61;
          auVar54._8_4_ = iVar65;
          auVar54._12_4_ = iVar65;
          auVar39 = pshuflw(auVar66 & auVar32,auVar54,0xe8);
          auVar66._0_4_ = -(uint)(auVar24._0_4_ == iVar21);
          auVar66._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
          auVar66._8_4_ = -(uint)(auVar24._8_4_ == iVar60);
          auVar66._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
          auVar43._4_4_ = auVar66._4_4_;
          auVar43._0_4_ = auVar66._4_4_;
          auVar43._8_4_ = auVar66._12_4_;
          auVar43._12_4_ = auVar66._12_4_;
          auVar24 = pshuflw(auVar66,auVar43,0xe8);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar42 = pshuflw(auVar39,auVar44,0xe8);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar32 = (auVar42 | auVar24 & auVar39) ^ auVar32;
          auVar24 = packssdw(auVar24 & auVar39,auVar32);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 0xb] = (uVar2 >> (bVar11 & 0x1f) & 0x10) == 0 ^ 0x31;
          }
          auVar44 = auVar43 & auVar54 | auVar44;
          auVar39 = packssdw(auVar44,auVar44);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24,auVar39 ^ auVar4);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._4_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 10] = (uVar2 >> (bVar11 & 0x1f) & 0x20) == 0 ^ 0x31;
          }
          auVar24 = auVar71 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar63._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar63._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar45._4_4_ = iVar61;
          auVar45._0_4_ = iVar61;
          auVar45._8_4_ = iVar65;
          auVar45._12_4_ = iVar65;
          iVar61 = -(uint)(auVar24._4_4_ == iVar38);
          iVar65 = -(uint)(auVar24._12_4_ == iVar26);
          auVar55._4_4_ = iVar61;
          auVar55._0_4_ = iVar61;
          auVar55._8_4_ = iVar65;
          auVar55._12_4_ = iVar65;
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar24 = auVar55 & auVar45 | auVar63;
          auVar24 = packssdw(auVar24,auVar24);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar5,auVar24 ^ auVar5);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 9] = (uVar2 >> (bVar11 & 0x1f) & 0x40) == 0 ^ 0x31;
          }
          auVar24 = pshufhw(auVar24,auVar45,0x84);
          auVar42 = pshufhw(auVar45,auVar55,0x84);
          auVar39 = pshufhw(auVar24,auVar63,0x84);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar34 = (auVar39 | auVar42 & auVar24) ^ auVar34;
          auVar24 = packssdw(auVar34,auVar34);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._6_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 8] = (byte)~(byte)(uVar2 >> (bVar11 & 0x1f)) >> 7 ^ 0x31;
          }
          auVar24 = auVar31 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar47._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar47._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar56._4_4_ = iVar61;
          auVar56._0_4_ = iVar61;
          auVar56._8_4_ = iVar65;
          auVar56._12_4_ = iVar65;
          auVar32 = pshuflw(auVar32,auVar56,0xe8);
          auVar35._0_4_ = -(uint)(auVar24._0_4_ == iVar21);
          auVar35._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
          auVar35._8_4_ = -(uint)(auVar24._8_4_ == iVar60);
          auVar35._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
          auVar46._4_4_ = auVar35._4_4_;
          auVar46._0_4_ = auVar35._4_4_;
          auVar46._8_4_ = auVar35._12_4_;
          auVar46._12_4_ = auVar35._12_4_;
          auVar24 = pshuflw(auVar35,auVar46,0xe8);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar39 = pshuflw(auVar32,auVar47,0xe8);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar39 | auVar24 & auVar32) ^ auVar67;
          auVar39 = packssdw(auVar67,auVar67);
          auVar24 = packsswb(auVar24 & auVar32,auVar39);
          if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 7] = ((uVar2 >> (bVar11 & 0x1f)) >> 8 & 1) == 0 ^ 0x31;
          }
          auVar47 = auVar46 & auVar56 | auVar47;
          auVar32 = packssdw(auVar47,auVar47);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar32 = packssdw(auVar32 ^ auVar6,auVar32 ^ auVar6);
          auVar24 = packsswb(auVar24,auVar32);
          if ((auVar24._8_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 6] = ((uVar2 >> (bVar11 & 0x1f)) >> 9 & 1) == 0 ^ 0x31;
          }
          auVar24 = auVar30 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar64._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar64._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar48._4_4_ = iVar61;
          auVar48._0_4_ = iVar61;
          auVar48._8_4_ = iVar65;
          auVar48._12_4_ = iVar65;
          iVar61 = -(uint)(auVar24._4_4_ == iVar38);
          iVar65 = -(uint)(auVar24._12_4_ == iVar26);
          auVar57._4_4_ = iVar61;
          auVar57._0_4_ = iVar61;
          auVar57._8_4_ = iVar65;
          auVar57._12_4_ = iVar65;
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar24 = auVar57 & auVar48 | auVar64;
          auVar24 = packssdw(auVar24,auVar24);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar7,auVar24 ^ auVar7);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 5] = ((uVar2 >> (bVar11 & 0x1f)) >> 10 & 1) == 0 ^ 0x31;
          }
          auVar24 = pshufhw(auVar24,auVar48,0x84);
          auVar42 = pshufhw(auVar48,auVar57,0x84);
          auVar32 = pshufhw(auVar24,auVar64,0x84);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar36 = (auVar32 | auVar42 & auVar24) ^ auVar36;
          auVar24 = packssdw(auVar36,auVar36);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._10_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 4] = ((uVar2 >> (bVar11 & 0x1f)) >> 0xb & 1) == 0 ^ 0x31;
          }
          auVar24 = auVar29 ^ auVar10;
          iVar61 = -(uint)(iVar21 < auVar24._0_4_);
          auVar50._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar65 = -(uint)(iVar60 < auVar24._8_4_);
          auVar50._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar58._4_4_ = iVar61;
          auVar58._0_4_ = iVar61;
          auVar58._8_4_ = iVar65;
          auVar58._12_4_ = iVar65;
          auVar32 = pshuflw(auVar39,auVar58,0xe8);
          auVar37._0_4_ = -(uint)(auVar24._0_4_ == iVar21);
          auVar37._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
          auVar37._8_4_ = -(uint)(auVar24._8_4_ == iVar60);
          auVar37._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
          auVar49._4_4_ = auVar37._4_4_;
          auVar49._0_4_ = auVar37._4_4_;
          auVar49._8_4_ = auVar37._12_4_;
          auVar49._12_4_ = auVar37._12_4_;
          auVar24 = pshuflw(auVar37,auVar49,0xe8);
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar39 = pshuflw(auVar32,auVar50,0xe8);
          in_XMM11._8_4_ = 0xffffffff;
          in_XMM11._0_8_ = 0xffffffffffffffff;
          in_XMM11._12_4_ = 0xffffffff;
          in_XMM11 = (auVar39 | auVar24 & auVar32) ^ in_XMM11;
          auVar24 = packssdw(auVar24 & auVar32,in_XMM11);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 3] = ((uVar2 >> (bVar11 & 0x1f)) >> 0xc & 1) == 0 ^ 0x31;
          }
          auVar50 = auVar49 & auVar58 | auVar50;
          auVar32 = packssdw(auVar50,auVar50);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24,auVar32 ^ auVar8);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._12_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14 - 2] = ((uVar2 >> (bVar11 & 0x1f)) >> 0xd & 1) == 0 ^ 0x31;
          }
          auVar24 = auVar27 ^ auVar10;
          iVar21 = -(uint)(iVar21 < auVar24._0_4_);
          auVar59._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
          iVar60 = -(uint)(iVar60 < auVar24._8_4_);
          auVar59._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
          auVar51._4_4_ = iVar21;
          auVar51._0_4_ = iVar21;
          auVar51._8_4_ = iVar60;
          auVar51._12_4_ = iVar60;
          iVar21 = -(uint)(auVar24._4_4_ == iVar38);
          iVar38 = -(uint)(auVar24._12_4_ == iVar26);
          auVar25._4_4_ = iVar21;
          auVar25._0_4_ = iVar21;
          auVar25._8_4_ = iVar38;
          auVar25._12_4_ = iVar38;
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar24 = auVar25 & auVar51 | auVar59;
          auVar24 = packssdw(auVar24,auVar24);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar9,auVar24 ^ auVar9);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar17[uVar14 - 1] = ((uVar2 >> (bVar11 & 0x1f)) >> 0xe & 1) == 0 ^ 0x31;
          }
          auVar32 = pshufhw(auVar24,auVar51,0x84);
          auVar24 = pshufhw(auVar25,auVar25,0x84);
          auVar39 = pshufhw(auVar32,auVar59,0x84);
          in_XMM5._8_4_ = 0xffffffff;
          in_XMM5._0_8_ = 0xffffffffffffffff;
          in_XMM5._12_4_ = 0xffffffff;
          in_XMM5 = (auVar39 | auVar24 & auVar32) ^ in_XMM5;
          auVar24 = packssdw(auVar24 & auVar32,in_XMM5);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._14_2_ >> 8 & 1) != 0) {
            pcVar17[uVar14] = -1 < (short)(uVar2 >> (bVar11 & 0x1f)) ^ 0x31;
          }
          uVar14 = uVar14 + 0x10;
          lVar28 = auVar68._8_8_;
          auVar68._0_8_ = auVar68._0_8_ + 0x10;
          auVar68._8_8_ = lVar28 + 0x10;
          lVar28 = auVar69._8_8_;
          auVar69._0_8_ = auVar69._0_8_ + 0x10;
          auVar69._8_8_ = lVar28 + 0x10;
          lVar28 = auVar70._8_8_;
          auVar70._0_8_ = auVar70._0_8_ + 0x10;
          auVar70._8_8_ = lVar28 + 0x10;
          lVar28 = auVar71._8_8_;
          auVar71._0_8_ = auVar71._0_8_ + 0x10;
          auVar71._8_8_ = lVar28 + 0x10;
          lVar28 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 0x10;
          auVar31._8_8_ = lVar28 + 0x10;
          lVar28 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 0x10;
          auVar30._8_8_ = lVar28 + 0x10;
          lVar28 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 0x10;
          auVar29._8_8_ = lVar28 + 0x10;
          lVar28 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 0x10;
          auVar27._8_8_ = lVar28 + 0x10;
        } while ((uVar22 + 0xf & 0x70) != uVar14);
        (pcVar13 + uVar15 + lVar18)[0] = ' ';
        (pcVar13 + uVar15 + lVar18)[1] = '1';
        pcVar13[uVar15 + lVar18 + 2] = '\n';
        uVar16 = uVar16 + 1;
        pcVar17 = pcVar17 + uVar19;
      } while (uVar16 != uVar20);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(p);
  }
  else {
    pcVar13 = (char *)0x0;
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth);
  }
  return pcVar13;
}

Assistant:

char * Abc_SopFromTruthHex( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = (nTruthSize < 2) ? 2 : Abc_Base2Log(nTruthSize) + 2;
    if ( nTruthSize != (1 << (nVars-2)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '9' )
            Digit = pTruth[i] - '0';
        else if ( pTruth[i] >= 'a' && pTruth[i] <= 'f' )
            Digit = 10 + pTruth[i] - 'a';
        else if ( pTruth[i] >= 'A' && pTruth[i] <= 'F' )
            Digit = 10 + pTruth[i] - 'A';
        else
        {
            printf( "String %s does not look like a hexadecimal representation of the truth table.\n", pTruth );
            return NULL;
        }
        for ( b = 0; b < 4; b++ )
            if ( Digit & (1 << b) )
                Vec_IntPush( vMints, 4*(nTruthSize-1-i)+b );
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
//            if ( Mint & (1 << (nVars-1-b)) )
            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
/*
    // create TT representation
    {
        extern void Bdc_ManDecomposeTest( unsigned uTruth, int nVars );
        unsigned uTruth = 0;
        int nVarsAll = 4;
        assert( nVarsAll == 4 );
        assert( nVars <= nVarsAll );
        Vec_IntForEachEntry( vMints, Mint, i )
            uTruth |= (1 << Mint);
//        uTruth = uTruth | (uTruth << 8) | (uTruth << 16) | (uTruth << 24);
        uTruth = uTruth | (uTruth << 16);
        Bdc_ManDecomposeTest( uTruth, nVarsAll );
    }
*/
    Vec_IntFree( vMints );
    return pSopCover;
}